

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O0

Hop_Obj_t * Hop_Complement(Hop_Man_t *p,Hop_Obj_t *pRoot,int iVar)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *pVar;
  int iVar_local;
  Hop_Obj_t *pRoot_local;
  Hop_Man_t *p_local;
  
  iVar1 = Hop_ManPiNum(p);
  if (iVar < iVar1) {
    pHVar2 = Hop_Regular(pRoot);
    pVar = Hop_ManPi(p,iVar);
    Hop_Complement_rec(p,pHVar2,pVar);
    pHVar2 = Hop_Regular(pRoot);
    Hop_ConeUnmark_rec(pHVar2);
    pHVar2 = Hop_Regular(pRoot);
    pHVar2 = (Hop_Obj_t *)(pHVar2->field_0).pData;
    iVar1 = Hop_IsComplement(pRoot);
    p_local = (Hop_Man_t *)Hop_NotCond(pHVar2,iVar1);
  }
  else {
    printf("Hop_Complement(): The PI variable %d is not defined.\n",(ulong)(uint)iVar);
    p_local = (Hop_Man_t *)0x0;
  }
  return (Hop_Obj_t *)p_local;
}

Assistant:

Hop_Obj_t * Hop_Complement( Hop_Man_t * p, Hop_Obj_t * pRoot, int iVar )
{
    // quit if the PI variable is not defined
    if ( iVar >= Hop_ManPiNum(p) )
    {
        printf( "Hop_Complement(): The PI variable %d is not defined.\n", iVar );
        return NULL;
    }
    // recursively perform composition
    Hop_Complement_rec( p, Hop_Regular(pRoot), Hop_ManPi(p, iVar) );
    // clear the markings
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    return Hop_NotCond( (Hop_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );
}